

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  PromiseArena *params;
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  PromiseBase this_00;
  void *pvVar4;
  PromiseArena *in_RCX;
  TransformPromiseNodeBase *this_01;
  PromiseArena *pPVar5;
  bool bVar6;
  OwnPromiseNode local_80;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_77;
  OwnPromiseNode local_58;
  PromiseBase local_50;
  Fault f;
  
  bVar6 = output[7]._vptr_AsyncOutputStream == (_func_int **)0x0;
  _kjCondition.value = bVar6;
  local_50.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (bVar6) {
    params = (PromiseArena *)(output + 7);
    pPVar5 = (PromiseArena *)
             ((long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream);
    if (in_RCX < pPVar5) {
      pPVar5 = in_RCX;
    }
    (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
              (&local_80,output[4]._vptr_AsyncOutputStream,amount2,pPVar5);
    OVar3.ptr = local_80.ptr;
    pp_Var1 = output[2]._vptr_AsyncOutputStream;
    pPVar2 = ((local_80.ptr)->super_PromiseArenaMember).arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_80.ptr - (long)pPVar2) < 0x50) {
      pvVar4 = operator_new(0x400);
      this_01 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3b0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,&local_80,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:825:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_32_4_39723cd8_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3b0) = &PTR_destroy_006dfb28;
      *(AsyncOutputStream **)((long)pvVar4 + 0x3d0) = output;
      *(uint64_t *)((long)pvVar4 + 0x3d8) = amount2;
      *(PromiseArena **)((long)pvVar4 + 0x3e0) = in_RCX;
      *(PromiseArena **)((long)pvVar4 + 1000) = pPVar5;
      *(_func_int ***)((long)pvVar4 + 0x3f0) = pp_Var1;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = params;
      *(void **)((long)pvVar4 + 0x3b8) = pvVar4;
    }
    else {
      ((local_80.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_01 = (TransformPromiseNodeBase *)(local_80.ptr + -5);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,&local_80,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:825:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_32_4_39723cd8_for_func::operator());
      OVar3.ptr[-5].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_006dfb28;
      OVar3.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)output;
      OVar3.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)amount2;
      OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)in_RCX;
      OVar3.ptr[-2].super_PromiseArenaMember.arena = pPVar5;
      OVar3.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var1;
      OVar3.ptr[-1].super_PromiseArenaMember.arena = params;
      OVar3.ptr[-5].super_PromiseArenaMember.arena = pPVar2;
    }
    f.exception = (Exception *)anon_var_dwarf_d0108e;
    __kjCondition = &this_01->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_58,(OwnPromiseNode *)&_kjCondition,(SourceLocation *)&f);
    this_00.node.ptr = local_50.node.ptr;
    OVar3.ptr = __kjCondition;
    if ((TransformPromiseNodeBase *)__kjCondition != (TransformPromiseNodeBase *)0x0) {
      __kjCondition = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)this_00.node.ptr,(Canceler *)params,
               (Promise<unsigned_long> *)&local_58);
    OVar3.ptr = local_58.ptr;
    if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    OVar3.ptr = local_80.ptr;
    if (&(local_80.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_80.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    return (Promise<unsigned_long>)(PromiseNode *)this_00.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x335,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}